

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VkDeviceAddress __thiscall
VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
          (VulkanLogicalDevice *this,VkAccelerationStructureKHR AS)

{
  VkDeviceAddress VVar1;
  VkAccelerationStructureDeviceAddressInfoKHR Info;
  VkAccelerationStructureDeviceAddressInfoKHR local_18;
  
  local_18.pNext = (void *)0x0;
  local_18.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_DEVICE_ADDRESS_INFO_KHR;
  local_18._4_4_ = 0;
  local_18.accelerationStructure = AS;
  VVar1 = (*vkGetAccelerationStructureDeviceAddressKHR)(this->m_VkDevice,&local_18);
  return VVar1;
}

Assistant:

VkDeviceAddress VulkanLogicalDevice::GetAccelerationStructureDeviceAddress(VkAccelerationStructureKHR AS) const
{
#if DILIGENT_USE_VOLK
    VkAccelerationStructureDeviceAddressInfoKHR Info = {};

    Info.sType                 = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_DEVICE_ADDRESS_INFO_KHR;
    Info.accelerationStructure = AS;

    return vkGetAccelerationStructureDeviceAddressKHR(m_VkDevice, &Info);
#else
    UNSUPPORTED("vkGetAccelerationStructureDeviceAddressKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}